

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::BufferStorage::MapPersistentDispatchTest::iterate(MapPersistentDispatchTest *this)

{
  ostringstream *poVar1;
  MapPersistentDispatchTest *pMVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  long lVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar7;
  pointer __s1;
  int *piVar8;
  char *description;
  int iVar9;
  qpTestResult testResult;
  MoveMapOwner MVar10;
  Buffer source;
  MapOwner source_map;
  MapOwner destination_map;
  Buffer destination;
  Program program;
  GLuint modified_source_data [16];
  GLuint destination_data [16];
  GLuint sum_data [16];
  GLuint source_data [16];
  GLuint modified_sum_data [16];
  Buffer local_440;
  string local_428;
  string local_408;
  Buffer local_3e8;
  MapPersistentDispatchTest *local_3d0;
  string local_3c8;
  string local_3a8;
  string local_388;
  Program local_368;
  int local_2f8 [4];
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int local_2c8;
  int iStack_2c4;
  int iStack_2c0;
  int iStack_2bc;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined1 local_278 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [6];
  ios_base local_200 [264];
  int local_f8 [16];
  int local_b8 [16];
  int local_78 [18];
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_288 = 0;
  uStack_280 = 0;
  lVar6 = 0;
  lVar7 = 0x10;
  iVar3 = 0;
  iVar9 = 0;
  do {
    local_2f8[lVar6] = (int)lVar7;
    local_b8[lVar6] = (int)lVar6;
    iVar9 = iVar9 + (int)lVar7;
    iVar3 = iVar3 + (int)lVar6;
    local_78[lVar6] = iVar9;
    local_f8[lVar6] = iVar3;
    lVar6 = lVar6 + 1;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  local_440.m_context = (this->super_TestCase).m_context;
  local_3e8.m_id = 0xffffffff;
  local_3e8.m_target = 0x8892;
  local_440.m_id = 0xffffffff;
  local_440.m_target = 0x8892;
  local_3e8.m_context = local_440.m_context;
  BufferStorage::Buffer::InitStorage(&local_3e8,0x90d2,0xc1,0x40,&local_2b8);
  BufferStorage::Buffer::InitStorage(&local_440,0x90d2,0xc2,0x40,local_b8);
  local_368.m_compute.m_context = (this->super_TestCase).m_context;
  local_368.m_id = 0;
  local_368.m_compute.m_id = 0;
  local_368.m_fragment.m_id = 0;
  local_368.m_geometry.m_id = 0;
  local_368.m_tess_ctrl.m_id = 0;
  local_368.m_tess_eval.m_id = 0;
  local_368.m_vertex.m_id = 0;
  local_3d0 = this;
  local_368.m_fragment.m_context = local_368.m_compute.m_context;
  local_368.m_geometry.m_context = local_368.m_compute.m_context;
  local_368.m_tess_ctrl.m_context = local_368.m_compute.m_context;
  local_368.m_tess_eval.m_context = local_368.m_compute.m_context;
  local_368.m_vertex.m_context = local_368.m_compute.m_context;
  local_368.m_context = local_368.m_compute.m_context;
  local_278._0_8_ = local_268;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_278,
             "#version 430 core\n\nlayout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nlayout (binding = 0, std430) buffer DestinationData {\n    uint values[];\n} destination;\n\nlayout (binding = 1, std430) buffer SourceData {\n    uint values[];\n} source;\n\nvoid main()\n{\n    uint index = gl_GlobalInvocationID.x;\n    uint sum   = 0u;\n\n    for (uint i = 0u; i <= index; ++i)\n    {\n        sum += source.values[i];\n    }\n\n    destination.values[index] = sum;\n}\n\n"
             ,"");
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,0x1b32ab9);
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,0x1b32ab9);
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,0x1b32ab9);
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,0x1b32ab9);
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,0x1b32ab9);
  BufferStorage::Program::Init
            (&local_368,(string *)local_278,&local_408,&local_428,&local_3a8,&local_3c8,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._0_8_ != local_268) {
    operator_delete((void *)local_278._0_8_,local_268[0]._M_allocated_capacity + 1);
  }
  (**(code **)(lVar5 + 0x1680))(local_368.m_id);
  pMVar2 = local_3d0;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x460);
  iVar3 = (*(local_3e8.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x40))(local_3e8.m_target,local_3e8.m_id);
  dVar4 = (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x800))();
  glu::checkError(dVar4,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x284);
  MVar10 = BufferStorage::Buffer::MapRange(&local_3e8,0,0x40,0xc1);
  __s1 = (pointer)MVar10.data;
  local_408._M_string_length = (size_type)MVar10.buffer;
  local_408._M_dataplus._M_p = __s1;
  iVar3 = (*(local_440.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar3) + 0x40))(local_440.m_target,local_440.m_id);
  dVar4 = (**(code **)(CONCAT44(extraout_var_01,iVar3) + 0x800))();
  glu::checkError(dVar4,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x284);
  MVar10 = BufferStorage::Buffer::MapRange(&local_440,0,0x40,0xc2);
  piVar8 = (int *)MVar10.data;
  local_428._M_string_length = (size_type)MVar10.buffer;
  local_428._M_dataplus._M_p = (pointer)piVar8;
  (**(code **)(lVar5 + 0x40))(0x90d2,0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x284);
  (**(code **)(lVar5 + 0x48))(0x90d2,0,local_3e8.m_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"BindBufferBase",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x291);
  (**(code **)(lVar5 + 0x48))(0x90d2,1,local_440.m_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"BindBufferBase",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x291);
  (**(code **)(lVar5 + 0x528))(0x10,1,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"DispatchCompute with persistently mapped buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xc04);
  (**(code **)(lVar5 + 0x648))();
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Finish",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xc08);
  iVar3 = bcmp(__s1,local_f8,0x40);
  if (iVar3 != 0) {
    local_278._0_8_ = ((pMVar2->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_278 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Contents of mapped region does not correspond with expected results",0x43);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_200);
  }
  piVar8[0xc] = local_2c8;
  piVar8[0xd] = iStack_2c4;
  piVar8[0xe] = iStack_2c0;
  piVar8[0xf] = iStack_2bc;
  piVar8[8] = local_2d8;
  piVar8[9] = iStack_2d4;
  piVar8[10] = iStack_2d0;
  piVar8[0xb] = iStack_2cc;
  piVar8[4] = local_2e8;
  piVar8[5] = iStack_2e4;
  piVar8[6] = iStack_2e0;
  piVar8[7] = iStack_2dc;
  *piVar8 = local_2f8[0];
  piVar8[1] = local_2f8[1];
  piVar8[2] = local_2f8[2];
  piVar8[3] = local_2f8[3];
  (**(code **)(lVar5 + 0x528))(0x10,1,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"DispatchCompute with persistently mapped buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xc18);
  (**(code **)(lVar5 + 0x648))();
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Finish",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xc1c);
  iVar9 = bcmp(__s1,local_78,0x40);
  if (iVar9 == 0) {
    BufferStorage::Buffer::MapOwner::~MapOwner((MapOwner *)&local_428);
    BufferStorage::Buffer::MapOwner::~MapOwner((MapOwner *)&local_408);
    if (iVar3 == 0) {
      testResult = QP_TEST_RESULT_PASS;
      description = "Pass";
      goto LAB_008782b1;
    }
  }
  else {
    local_278._0_8_ = ((pMVar2->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_278 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Contents of mapped region does not correspond with expected results",0x43);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_200);
    BufferStorage::Buffer::MapOwner::~MapOwner((MapOwner *)&local_428);
    BufferStorage::Buffer::MapOwner::~MapOwner((MapOwner *)&local_408);
  }
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_008782b1:
  tcu::TestContext::setTestResult
            (((pMVar2->super_TestCase).m_context)->m_testCtx,testResult,description);
  BufferStorage::Program::~Program(&local_368);
  BufferStorage::Buffer::~Buffer(&local_440);
  BufferStorage::Buffer::~Buffer(&local_3e8);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MapPersistentDispatchTest::iterate()
{
	static const GLchar* compute_shader = "#version 430 core\n"
										  "\n"
										  "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
										  "\n"
										  "layout (binding = 0, std430) buffer DestinationData {\n"
										  "    uint values[];\n"
										  "} destination;\n"
										  "\n"
										  "layout (binding = 1, std430) buffer SourceData {\n"
										  "    uint values[];\n"
										  "} source;\n"
										  "\n"
										  "void main()\n"
										  "{\n"
										  "    uint index = gl_GlobalInvocationID.x;\n"
										  "    uint sum   = 0u;\n"
										  "\n"
										  "    for (uint i = 0u; i <= index; ++i)\n"
										  "    {\n"
										  "        sum += source.values[i];\n"
										  "    }\n"
										  "\n"
										  "    destination.values[index] = sum;\n"
										  "}\n"
										  "\n";
	static const GLuint data_size			= 16;
	static const GLuint destination_binding = 0;
	static const GLuint source_binding		= 1;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	/* Prepare data */
	GLuint destination_data[data_size];
	GLuint modified_source_data[data_size];
	GLuint modified_sum_data[data_size];
	GLuint source_data[data_size];
	GLuint sum_data[data_size];

	GLuint modified_sum = 0;
	GLuint sum			= 0;

	for (GLuint i = 0; i < data_size; ++i)
	{
		destination_data[i]		= 0;
		modified_source_data[i] = data_size - i;
		source_data[i]			= i;

		modified_sum += modified_source_data[i];
		sum += source_data[i];

		modified_sum_data[i] = modified_sum;
		sum_data[i]			 = sum;
	}

	/* Prepare buffers */
	Buffer destination(m_context);
	Buffer source(m_context);

	destination.InitStorage(GL_SHADER_STORAGE_BUFFER, GL_MAP_COHERENT_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_READ_BIT,
							data_size * sizeof(GLuint), destination_data);

	source.InitStorage(GL_SHADER_STORAGE_BUFFER, GL_MAP_COHERENT_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_WRITE_BIT,
					   data_size * sizeof(GLuint), source_data);

	/* Prepare program */
	Program program(m_context);
	program.Init(compute_shader, "" /* fs */, "" /* gs */, "" /* tcs */, "" /* tes */, "" /* vs */);

	/*
	 * - bind buffers to SHADER_STORAGE_BUFFER;
	 * - use MapBufferRange to map both buffers; <access> shall be set as follows:
	 *   * MAP_COHERENT_BIT and MAP_PERSISTENT_BIT flags set for both
	 *   * MAP_WRITE_BIT flag shall be set for source;
	 *   * MAP_READ_BIT flag shall be set for destination;
	 * - dispatch program for 16x1x1 groups;
	 * - modify contents of source buffer via mapped memory;
	 * - execute Finish;
	 * - inspect contents of destination buffer via mapped memory; It is expected
	 * that it will contain results based on original content of source buffer;
	 * - dispatch program for 16x1x1 groups;
	 * - execute Finish;
	 * - inspect contents of destination buffer via mapped memory; It is expected
	 * that it will contain results based on modified content of source buffer.
	 */
	{
		/* Set program */
		Program::Use(gl, program.m_id);

		/* Map buffers */
		destination.Bind();
		const Buffer::MapOwner destination_map(destination.MapRange(
			0 /* offset */, data_size * sizeof(GLuint), GL_MAP_COHERENT_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_READ_BIT));

		source.Bind();
		const Buffer::MapOwner source_map(
			source.MapRange(0 /* offset */, data_size * sizeof(GLuint),
							GL_MAP_COHERENT_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_WRITE_BIT));

		/* Clear binding point */
		Buffer::Bind(gl, 0, GL_SHADER_STORAGE_BUFFER);

		/* Bind buffers */
		Buffer::BindBase(gl, destination.m_id, GL_SHADER_STORAGE_BUFFER, destination_binding);
		Buffer::BindBase(gl, source.m_id, GL_SHADER_STORAGE_BUFFER, source_binding);

		/* Execute program for 16x1x1 groups */
		gl.dispatchCompute(16, 1, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute with persistently mapped buffers");

		/* Make sure that program executed */
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "Finish");

		if (0 != memcmp(destination_map.m_data, sum_data, data_size * sizeof(GLuint)))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Contents of mapped region does not correspond with expected results"
												<< tcu::TestLog::EndMessage;
		}

		/* Modify source buffer via mapped area */
		memcpy(source_map.m_data, modified_source_data, data_size * sizeof(GLuint));

		/* Execute program for 16x1x1 groups */
		gl.dispatchCompute(16, 1, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute with persistently mapped buffers");

		/* Make sure that program executed */
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "Finish");

		if (0 != memcmp(destination_map.m_data, modified_sum_data, data_size * sizeof(GLuint)))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Contents of mapped region does not correspond with expected results"
												<< tcu::TestLog::EndMessage;
		}
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}